

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::
     doPrintValue(FloatFormat *fmt,Vector<float,_3> *value,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  float *value_00;
  int local_24;
  int ndx;
  ostream *os_local;
  Vector<float,_3> *value_local;
  FloatFormat *fmt_local;
  
  pcVar1 = dataTypeNameOf<tcu::Vector<float,3>>();
  poVar2 = std::operator<<(os,pcVar1);
  std::operator<<(poVar2,"(");
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    if (0 < local_24) {
      std::operator<<(os,", ");
    }
    value_00 = tcu::Vector<float,_3>::operator[](value,local_24);
    printValue<float>(fmt,value_00,os);
  }
  std::operator<<(os,")");
  return;
}

Assistant:

static void			doPrintValue	(const FloatFormat& fmt, const T& value, ostream& os)
	{
		os << dataTypeNameOf<T>() << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printValue<Element>(fmt, value[ndx], os);
		}

		os << ")";
	}